

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O3

int __thiscall UdpLayer::reset(UdpLayer *this,sockaddr_in *local)

{
  undefined8 uVar1;
  in_port_t iVar2;
  in_addr iVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->sockMtx);
  this->stopThread = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->sockMtx);
  (*(this->super_bdThread)._vptr_bdThread[4])(this);
  closeSocket(this);
  iVar2 = local->sin_port;
  iVar3.s_addr = (local->sin_addr).s_addr;
  uVar1 = *(undefined8 *)local->sin_zero;
  (this->laddr).sin_family = local->sin_family;
  (this->laddr).sin_port = iVar2;
  (this->laddr).sin_addr = (in_addr)iVar3.s_addr;
  *(undefined8 *)(this->laddr).sin_zero = uVar1;
  this->errorState = 0;
  this->ttl = 0x40;
  openSocket(this);
  return 1;
}

Assistant:

int UdpLayer::reset(struct sockaddr_in &local) {
#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset()" << std::endl;
#endif

	/* stop the old thread */
	{
		bdStackMutex stack(sockMtx);   /********** LOCK MUTEX *********/
#ifdef DEBUG_UDP_LAYER
		std::cerr << "UdpLayer::reset() setting stopThread flag" << std::endl;
#endif
		stopThread = true;
	}
#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() joining" << std::endl;
#endif

	join(); 

#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() closing socket" << std::endl;
#endif
	closeSocket();

#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() resetting variables" << std::endl;
#endif
	laddr = local;
	errorState = 0;
	ttl = UDP_DEF_TTL;

#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() opening socket" << std::endl;
#endif
	openSocket();

	return 1 ;
}